

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

bool ObjectTemp::IsTempUseOpCodeSym(Instr *instr,OpCode opcode,Sym *sym)

{
  byte bVar1;
  bool bVar2;
  PropertySymOpnd *pPVar3;
  StackSym *pSVar4;
  PropertySym *pPVar5;
  Opnd *pOVar6;
  IndirOpnd *pIVar7;
  RegOpnd *pRVar8;
  bool local_31;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  Sym *sym_local;
  OpCode opcode_local;
  Instr *instr_local;
  
  if (opcode == ArgOut_A) {
    return (bool)((byte)(*(ushort *)&instr->field_0x36 >> 3) & 1);
  }
  if ((((opcode != LdFld) && (opcode != LdFldForTypeOf)) && (opcode != LdFldForCallApplyTarget)) &&
     (opcode != LdMethodFld)) {
    if ((opcode != StFld) && (opcode != StFldStrict)) {
      if (opcode != InitFld) {
        if (opcode == LdElemI_A) {
          pOVar6 = IR::Instr::GetSrc1(instr);
          pIVar7 = IR::Opnd::AsIndirOpnd(pOVar6);
          pRVar8 = IR::IndirOpnd::GetBaseOpnd(pIVar7);
          return pRVar8->m_sym == (StackSym *)sym;
        }
        if ((opcode == StElemI_A) || (opcode == StElemI_A_Strict)) {
          pOVar6 = IR::Instr::GetDst(instr);
          pIVar7 = IR::Opnd::AsIndirOpnd(pOVar6);
          pRVar8 = IR::IndirOpnd::GetBaseOpnd(pIVar7);
          local_2c = false;
          if (pRVar8->m_sym == (StackSym *)sym) {
            pOVar6 = IR::Instr::GetSrc1(instr);
            pSVar4 = IR::Opnd::GetStackSym(pOVar6);
            local_2c = pSVar4 != (StackSym *)sym;
          }
          return local_2c;
        }
        if (opcode == LdLen_A) {
          pOVar6 = IR::Instr::GetSrc1(instr);
          bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
          if (bVar2) {
            pOVar6 = IR::Instr::GetSrc1(instr);
            pRVar8 = IR::Opnd::AsRegOpnd(pOVar6);
            pSVar4 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
            return pSVar4 == (StackSym *)sym;
          }
        }
        else {
          if (opcode == FromVar) {
            return true;
          }
          if (opcode != LdMethodFromFlags) {
            if (opcode == Memset) {
              pOVar6 = IR::Instr::GetDst(instr);
              pIVar7 = IR::Opnd::AsIndirOpnd(pOVar6);
              pRVar8 = IR::IndirOpnd::GetBaseOpnd(pIVar7);
              local_2d = true;
              if (pRVar8->m_sym != (StackSym *)sym) {
                pOVar6 = IR::Instr::GetSrc1(instr);
                bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
                local_2e = false;
                if (bVar2) {
                  pOVar6 = IR::Instr::GetSrc1(instr);
                  pRVar8 = IR::Opnd::AsRegOpnd(pOVar6);
                  local_2e = pRVar8->m_sym == (StackSym *)sym;
                }
                local_2d = local_2e;
              }
              return local_2d;
            }
            if (opcode == Memcopy) {
              pOVar6 = IR::Instr::GetDst(instr);
              pIVar7 = IR::Opnd::AsIndirOpnd(pOVar6);
              pRVar8 = IR::IndirOpnd::GetBaseOpnd(pIVar7);
              local_2f = true;
              if (pRVar8->m_sym != (StackSym *)sym) {
                pOVar6 = IR::Instr::GetSrc1(instr);
                pIVar7 = IR::Opnd::AsIndirOpnd(pOVar6);
                pRVar8 = IR::IndirOpnd::GetBaseOpnd(pIVar7);
                local_2f = pRVar8->m_sym == (StackSym *)sym;
              }
              return local_2f;
            }
            bVar2 = OpCodeAttr::OpndHasImplicitCall(opcode);
            if (bVar2) {
              return false;
            }
            bVar2 = OpCodeAttr::TempObjectSources(opcode);
            local_30 = false;
            if (bVar2) {
              bVar2 = OpCodeAttr::TempObjectTransfer(opcode);
              local_31 = true;
              if (bVar2) {
                local_31 = (bool)((byte)(*(ushort *)&instr->field_0x36 >> 3) & 1);
              }
              local_30 = local_31;
            }
            return local_30;
          }
        }
        goto LAB_0085a3e7;
      }
      pOVar6 = IR::Instr::GetDst(instr);
      pPVar3 = IR::Opnd::AsPropertySymOpnd(pOVar6);
      pPVar5 = IR::PropertySymOpnd::GetPropertySym(pPVar3);
      bVar1 = Js::PropertyRecord::DefaultAttributesForPropertyId(pPVar5->m_propertyId,true);
      if ((bVar1 & 8) != 0) {
        return false;
      }
    }
    pOVar6 = IR::Instr::GetSrc1(instr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetSrc1(instr);
      pSVar4 = IR::Opnd::GetStackSym(pOVar6);
      if (pSVar4 == (StackSym *)sym) {
        return false;
      }
    }
    pOVar6 = IR::Instr::GetSrc2(instr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetSrc2(instr);
      pSVar4 = IR::Opnd::GetStackSym(pOVar6);
      if (pSVar4 == (StackSym *)sym) {
        return false;
      }
    }
    pOVar6 = IR::Instr::GetDst(instr);
    pPVar3 = IR::Opnd::AsPropertySymOpnd(pOVar6);
    pSVar4 = IR::PropertySymOpnd::GetObjectSym(pPVar3);
    return pSVar4 == (StackSym *)sym;
  }
LAB_0085a3e7:
  pOVar6 = IR::Instr::GetSrc1(instr);
  pPVar3 = IR::Opnd::AsPropertySymOpnd(pOVar6);
  pSVar4 = IR::PropertySymOpnd::GetObjectSym(pPVar3);
  return pSVar4 == (StackSym *)sym;
}

Assistant:

bool
ObjectTemp::IsTempUseOpCodeSym(IR::Instr * instr, Js::OpCode opcode, Sym * sym)
{
    // Special case ArgOut_A which communicate information about CallDirect
    switch (opcode)
    {
    case Js::OpCode::ArgOut_A:
        return instr->dstIsTempObject;
    case Js::OpCode::LdLen_A:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            return instr->GetSrc1()->AsRegOpnd()->GetStackSym() == sym;
        }
        // fall through
    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdMethodFromFlags:
        return instr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym() == sym;
    case Js::OpCode::InitFld:
        if (Js::PropertyRecord::DefaultAttributesForPropertyId(
                instr->GetDst()->AsPropertySymOpnd()->GetPropertySym()->m_propertyId, true) & PropertyDeleted)
        {
            // If the property record is marked PropertyDeleted, the InitFld will cause a type handler conversion,
            // which may result in creation of a weak reference to the object itself.
            return false;
        }
        // Fall through
    case Js::OpCode::StFld:
    case Js::OpCode::StFldStrict:
        return
            !(instr->GetSrc1() && instr->GetSrc1()->GetStackSym() == sym) &&
            !(instr->GetSrc2() && instr->GetSrc2()->GetStackSym() == sym) &&
            instr->GetDst()->AsPropertySymOpnd()->GetObjectSym() == sym;
    case Js::OpCode::LdElemI_A:
        return instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym;
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym && instr->GetSrc1()->GetStackSym() != sym;
    case Js::OpCode::Memset:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym || (instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym == sym);
    case Js::OpCode::Memcopy:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym || instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym;

    // Special case FromVar for now until we can allow CallsValueOf opcode to be accept temp use
    case Js::OpCode::FromVar:
        return true;
    }

    // TODO: Currently, when we disable implicit call, we still don't allow valueOf/toString that has no side effects
    // So we shouldn't mark them if we have use of the sym on opcode that does OpndHasImplicitCall yet.
    if (OpCodeAttr::OpndHasImplicitCall(opcode))
    {
        return false;
    }

    // Mark the symbol as non-tempable if the instruction doesn't allow temp sources,
    // or it is transferred to a non-temp dst
    return (OpCodeAttr::TempObjectSources(opcode)
        && (!OpCodeAttr::TempObjectTransfer(opcode) || instr->dstIsTempObject));
}